

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinExport::WriteBinaryNode(AssbinExport *this,IOStream *container,aiNode *node)

{
  undefined4 uVar1;
  aiMetadataEntry *paVar2;
  aiString *s;
  long lVar3;
  uint i_2;
  uint i;
  ulong uVar4;
  long lVar5;
  undefined8 uStack_80;
  undefined2 local_76;
  uint nb_metadata;
  AssbinChunkWriter chunk;
  
  chunk.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_00758758;
  chunk.buffer = (uint8_t *)0x0;
  chunk.magic = 0x123c;
  chunk.cur_size = 0;
  chunk.cursor = 0;
  chunk.initial = 0x1000;
  if (node->mMetaData == (aiMetadata *)0x0) {
    nb_metadata = 0;
  }
  else {
    nb_metadata = node->mMetaData->mNumProperties;
  }
  chunk.container = container;
  Write<aiString>(&chunk.super_IOStream,&node->mName);
  Write<aiMatrix4x4t<float>>(&chunk.super_IOStream,&node->mTransformation);
  Write<unsigned_int>(&chunk.super_IOStream,&node->mNumChildren);
  Write<unsigned_int>(&chunk.super_IOStream,&node->mNumMeshes);
  Write<unsigned_int>(&chunk.super_IOStream,&nb_metadata);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < node->mNumMeshes; uVar4 = uVar4 + 1) {
    Write<unsigned_int>(&chunk.super_IOStream,(uint *)((long)node->mMeshes + lVar3));
    lVar3 = lVar3 + 4;
  }
  for (uVar4 = 0; uVar4 < node->mNumChildren; uVar4 = uVar4 + 1) {
    WriteBinaryNode(this,&chunk.super_IOStream,node->mChildren[uVar4]);
  }
  lVar3 = 8;
  lVar5 = 0;
  uVar4 = 0;
  do {
    if (nb_metadata <= uVar4) {
      AssbinChunkWriter::~AssbinChunkWriter(&chunk);
      return;
    }
    paVar2 = node->mMetaData->mValues;
    uVar1 = *(undefined4 *)((long)paVar2 + lVar3 + -8);
    s = *(aiString **)((long)&paVar2->mType + lVar3);
    Write<aiString>(&chunk.super_IOStream,(aiString *)(node->mMetaData->mKeys->data + lVar5 + -4));
    local_76 = (undefined2)uVar1;
    (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&local_76,2,1);
    uStack_80 = 1;
    switch(uVar1) {
    case 0:
      goto switchD_00325a0b_caseD_0;
    case 1:
    case 3:
      uStack_80 = 4;
      goto switchD_00325a0b_caseD_0;
    case 2:
    case 4:
      uStack_80 = 8;
switchD_00325a0b_caseD_0:
      (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,s,uStack_80,1);
      break;
    case 5:
      Write<aiString>(&chunk.super_IOStream,s);
      break;
    case 6:
      Write<aiVector3t<float>>(&chunk.super_IOStream,(aiVector3D *)s);
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x404;
    lVar3 = lVar3 + 0x10;
  } while( true );
}

Assistant:

void WriteBinaryNode( IOStream * container, const aiNode* node)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AINODE );

        unsigned int nb_metadata = (node->mMetaData != NULL ? node->mMetaData->mNumProperties : 0);

        Write<aiString>(&chunk,node->mName);
        Write<aiMatrix4x4>(&chunk,node->mTransformation);
        Write<unsigned int>(&chunk,node->mNumChildren);
        Write<unsigned int>(&chunk,node->mNumMeshes);
        Write<unsigned int>(&chunk,nb_metadata);

        for (unsigned int i = 0; i < node->mNumMeshes;++i) {
            Write<unsigned int>(&chunk,node->mMeshes[i]);
        }

        for (unsigned int i = 0; i < node->mNumChildren;++i) {
            WriteBinaryNode( &chunk, node->mChildren[i] );
        }

        for (unsigned int i = 0; i < nb_metadata; ++i) {
            const aiString& key = node->mMetaData->mKeys[i];
            aiMetadataType type = node->mMetaData->mValues[i].mType;
            void* value = node->mMetaData->mValues[i].mData;

            Write<aiString>(&chunk, key);
            Write<uint16_t>(&chunk, type);

            switch (type) {
                case AI_BOOL:
                    Write<bool>(&chunk, *((bool*) value));
                    break;
                case AI_INT32:
                    Write<int32_t>(&chunk, *((int32_t*) value));
                    break;
                case AI_UINT64:
                    Write<uint64_t>(&chunk, *((uint64_t*) value));
                    break;
                case AI_FLOAT:
                    Write<float>(&chunk, *((float*) value));
                    break;
                case AI_DOUBLE:
                    Write<double>(&chunk, *((double*) value));
                    break;
                case AI_AISTRING:
                    Write<aiString>(&chunk, *((aiString*) value));
                    break;
                case AI_AIVECTOR3D:
                    Write<aiVector3D>(&chunk, *((aiVector3D*) value));
                    break;
#ifdef SWIG
                case FORCE_32BIT:
#endif // SWIG
                default:
                    break;
            }
        }
    }